

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_crossover(void *highs,int num_col,int num_row,double *col_value,double *col_dual,
                        double *row_dual)

{
  value_type vVar1;
  HighsStatus HVar2;
  reference pvVar3;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  long in_R8;
  long in_R9;
  int row;
  int col_1;
  int col;
  HighsSolution solution;
  HighsSolution *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar4;
  int in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  Highs *in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> local_88;
  vector<double,_std::allocator<double>_> local_70 [2];
  vector<double,_std::allocator<double>_> local_40;
  long local_28;
  long local_20;
  long local_18;
  int local_10;
  int local_c;
  
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  HighsSolution::HighsSolution(in_stack_ffffffffffffff40);
  if (local_18 != 0) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (in_stack_ffffffffffffff60 = 0; in_stack_ffffffffffffff60 < local_c;
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1) {
      vVar1 = *(value_type *)(local_18 + (long)in_stack_ffffffffffffff60 * 8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&local_88,(long)in_stack_ffffffffffffff60);
      *pvVar3 = vVar1;
    }
  }
  if ((local_20 != 0) && (local_28 != 0)) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    for (iVar4 = 0; iVar4 < local_c; iVar4 = iVar4 + 1) {
      vVar1 = *(value_type *)(local_20 + (long)iVar4 * 8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_70,(long)iVar4);
      *pvVar3 = vVar1;
    }
    for (iVar4 = 0; iVar4 < local_10; iVar4 = iVar4 + 1) {
      in_stack_ffffffffffffff40 = *(HighsSolution **)(local_28 + (long)iVar4 * 8);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&local_40,(long)iVar4);
      *pvVar3 = (value_type)in_stack_ffffffffffffff40;
    }
  }
  HVar2 = Highs::crossover(in_stack_ffffffffffffff68,
                           (HighsSolution *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  HighsSolution::~HighsSolution(in_stack_ffffffffffffff40);
  return HVar2;
}

Assistant:

HighsInt Highs_crossover(void* highs, const int num_col, const int num_row,
                         const double* col_value, const double* col_dual,
                         const double* row_dual) {
  HighsSolution solution;
  if (col_value) {
    solution.value_valid = true;
    solution.col_value.resize(num_col);
    for (int col = 0; col < num_col; col++)
      solution.col_value[col] = col_value[col];
  }

  if (col_dual && row_dual) {
    solution.dual_valid = true;
    solution.col_dual.resize(num_col);
    solution.row_dual.resize(num_row);
    for (int col = 0; col < num_col; col++)
      solution.col_dual[col] = col_dual[col];
    for (int row = 0; row < num_row; row++)
      solution.row_dual[row] = row_dual[row];
  }

  return (HighsInt)((Highs*)highs)->crossover(solution);
}